

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# speculative.cpp
# Opt level: O0

common_speculative * common_speculative_init(llama_context *ctx_dft)

{
  initializer_list<common_sampler_type> __l;
  undefined4 uVar1;
  common_speculative *pcVar2;
  common_params_sampling *this;
  common_sampler *pcVar3;
  llama_context *in_RDI;
  common_params_sampling *in_stack_00000020;
  common_params_sampling params;
  common_speculative *result;
  common_params_sampling *in_stack_000002d0;
  llama_model *in_stack_000002d8;
  llama_batch *this_00;
  
  pcVar2 = (common_speculative *)operator_new(0x60);
  pcVar2->ctx = in_RDI;
  pcVar2->smpl = (common_sampler *)0x0;
  this_00 = &pcVar2->batch;
  uVar1 = llama_n_batch(in_RDI);
  llama_batch_init(this_00,uVar1,0,1);
  (pcVar2->prompt).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (pcVar2->prompt).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (pcVar2->prompt).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  httplib::detail::std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)0x43b367);
  common_params_sampling::common_params_sampling(in_stack_00000020);
  __l._M_array._4_4_ = 2;
  __l._M_array._0_4_ = uVar1;
  __l._M_len = (size_type)&stack0xfffffffffffffeac;
  std::vector<common_sampler_type,_std::allocator<common_sampler_type>_>::operator=
            ((vector<common_sampler_type,_std::allocator<common_sampler_type>_> *)this_00,__l);
  this = (common_params_sampling *)llama_get_model(in_RDI);
  pcVar3 = common_sampler_init(in_stack_000002d8,in_stack_000002d0);
  pcVar2->smpl = pcVar3;
  common_params_sampling::~common_params_sampling(this);
  return pcVar2;
}

Assistant:

struct common_speculative * common_speculative_init(
        struct llama_context * ctx_dft) {
    auto * result = new common_speculative {
        /* .ctx    = */ ctx_dft,
        /* .smpl   = */ nullptr,
        /* .batch  = */ llama_batch_init(llama_n_batch(ctx_dft), 0, 1),
        /* .prompt = */ {},
    };

    // TODO: optimize or pass from outside?
#if 0
    {
        common_params_sampling params;
        params.no_perf = false;

        params.top_k = 40;
        params.top_p = 0.9;

        params.samplers = {
            COMMON_SAMPLER_TYPE_TOP_K,
            COMMON_SAMPLER_TYPE_TOP_P,
            COMMON_SAMPLER_TYPE_INFILL,
        };

        result->smpl = common_sampler_init(llama_get_model(ctx_dft), params);
    }
#else
    {
        common_params_sampling params;
        params.no_perf = false;

        params.top_k = 10;

        params.samplers = {
            COMMON_SAMPLER_TYPE_TOP_K,
        };

        result->smpl = common_sampler_init(llama_get_model(ctx_dft), params);
    }
#endif

    return result;
}